

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

string * __thiscall
lunasvg::parseUrl_abi_cxx11_(string *__return_storage_ptr__,lunasvg *this,string_view input)

{
  bool bVar1;
  undefined1 local_20 [8];
  string_view input_local;
  string *value;
  
  input_local._M_len = input._M_len;
  local_20 = (undefined1  [8])this;
  input_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = parseUrlValue((string_view *)local_20,__return_storage_ptr__);
  if ((!bVar1) ||
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_20), !bVar1)) {
    std::__cxx11::string::clear();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string parseUrl(std::string_view input)
{
    std::string value;
    if(!parseUrlValue(input, value) || !input.empty())
        value.clear();
    return value;
}